

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_null(uchar **p,uchar *start)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  
  puVar1 = *p;
  if ((long)puVar1 - (long)start < 1) {
    iVar2 = -0x6c;
  }
  else {
    *p = puVar1 + -1;
    puVar1[-1] = '\0';
    iVar2 = 1;
  }
  if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
    puVar1 = *p;
    if (puVar1 == start || (long)puVar1 - (long)start < 0) {
      iVar3 = -0x6c;
      iVar2 = 0;
    }
    else {
      *p = puVar1 + -1;
      puVar1[-1] = '\x05';
      iVar3 = 1;
    }
    iVar2 = iVar2 + iVar3;
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_write_len( unsigned char **p, unsigned char *start, size_t len )
{
    if( len < 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = (unsigned char) len;
        return( 1 );
    }

    if( len <= 0xFF )
    {
        if( *p - start < 2 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = (unsigned char) len;
        *--(*p) = 0x81;
        return( 2 );
    }

    if( len <= 0xFFFF )
    {
        if( *p - start < 3 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = ( len       ) & 0xFF;
        *--(*p) = ( len >>  8 ) & 0xFF;
        *--(*p) = 0x82;
        return( 3 );
    }

    if( len <= 0xFFFFFF )
    {
        if( *p - start < 4 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = ( len       ) & 0xFF;
        *--(*p) = ( len >>  8 ) & 0xFF;
        *--(*p) = ( len >> 16 ) & 0xFF;
        *--(*p) = 0x83;
        return( 4 );
    }

    if( len <= 0xFFFFFFFF )
    {
        if( *p - start < 5 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = ( len       ) & 0xFF;
        *--(*p) = ( len >>  8 ) & 0xFF;
        *--(*p) = ( len >> 16 ) & 0xFF;
        *--(*p) = ( len >> 24 ) & 0xFF;
        *--(*p) = 0x84;
        return( 5 );
    }

    return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );
}